

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

int Jf_ManComputeDelay(Jf_Man_t *p,int fEval)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  float *pfVar4;
  float *pfVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Gia_Obj_t *pGVar10;
  int *piVar11;
  Jf_Par_t *pJVar12;
  long lVar13;
  int fReverse;
  int iVar14;
  Gia_Man_t *pGVar15;
  uint *c;
  uint i;
  ulong uVar16;
  float fVar17;
  
  if (fEval != 0) {
    iVar14 = 0;
    while ((iVar14 < p->pGia->nObjs &&
           (pGVar10 = Gia_ManObj(p->pGia,iVar14), pGVar10 != (Gia_Obj_t *)0x0))) {
      iVar7 = Gia_ObjIsBuf(pGVar10);
      if (iVar7 != 0) {
        Jf_ObjPropagateBuf(p,pGVar10,fReverse);
        piVar11 = p->pGia->pRefs;
        if (piVar11 == (int *)0x0) {
          __assert_fail("p->pGia->pRefs != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x522,"int Jf_ManComputeRefs(Jf_Man_t *)");
        }
        pfVar4 = (p->vRefs).pArray;
        pfVar5 = (p->vFlow).pArray;
        memset(piVar11,0,(long)p->pGia->nObjs << 2);
        pJVar12 = p->pPars;
        pJVar12->Area = 0;
        pJVar12->Edge = 0;
        pGVar15 = p->pGia;
        iVar14 = pGVar15->nObjs;
        goto LAB_005ec3f8;
      }
      if (((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) &&
         (iVar7 = Gia_ObjRefNum(p->pGia,pGVar10), 0 < iVar7)) {
        piVar11 = Jf_ObjCuts(p,iVar14);
        iVar7 = Jf_CutArr(p,piVar11 + 1);
        Vec_IntWriteEntry(&p->vArr,iVar14,iVar7);
      }
      iVar14 = iVar14 + 1;
    }
  }
  iVar7 = 0;
  iVar14 = 0;
  while( true ) {
    if (p->pGia->vCos->nSize <= iVar7) {
      return iVar14;
    }
    pGVar10 = Gia_ManCo(p->pGia,iVar7);
    uVar3 = *(undefined8 *)pGVar10;
    iVar8 = Gia_ObjRefNum(p->pGia,pGVar10 + -(ulong)((uint)uVar3 & 0x1fffffff));
    if (iVar8 < 1) break;
    iVar8 = Gia_ObjId(p->pGia,pGVar10 + -(ulong)((uint)uVar3 & 0x1fffffff));
    iVar8 = Vec_IntEntry(&p->vArr,iVar8);
    if (iVar14 <= iVar8) {
      iVar14 = iVar8;
    }
    iVar7 = iVar7 + 1;
  }
  __assert_fail("Gia_ObjRefNum(p->pGia, pObj) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                ,0x517,"int Jf_ManComputeDelay(Jf_Man_t *, int)");
LAB_005ec3f8:
  if (iVar14 < 1) {
LAB_005ec51b:
    iVar14 = pGVar15->nObjs;
    lVar13 = 0;
    do {
      if (iVar14 <= lVar13) {
        iVar14 = Jf_ManComputeDelay(p,1);
        pJVar12 = p->pPars;
        pJVar12->Delay = (long)iVar14;
        return (int)pJVar12->Area;
      }
      fVar2 = pfVar4[lVar13];
      fVar17 = 0.2;
      fVar6 = 0.8;
      if (p->pPars->fOptEdge != 0) {
        fVar6 = fVar17;
        fVar17 = 0.8;
      }
      fVar6 = fVar2 * fVar17 + (float)pGVar15->pRefs[lVar13] * fVar6;
      fVar17 = 1.0;
      if (1.0 <= fVar6) {
        fVar17 = fVar6;
      }
      pfVar5[lVar13] = (fVar2 * pfVar5[lVar13]) / fVar17;
      pfVar4[lVar13] = fVar17;
      pfVar1 = pfVar5 + lVar13;
      lVar13 = lVar13 + 1;
    } while (0.0 <= *pfVar1);
    __assert_fail("pFlow[i] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x53d,"int Jf_ManComputeRefs(Jf_Man_t *)");
  }
  iVar14 = iVar14 + -1;
  pGVar10 = Gia_ManObj(pGVar15,iVar14);
  if (pGVar10 == (Gia_Obj_t *)0x0) {
    pGVar15 = p->pGia;
    goto LAB_005ec51b;
  }
  iVar7 = (int)*(ulong *)pGVar10;
  uVar16 = *(ulong *)pGVar10 & 0x1fffffff;
  if ((iVar7 < 0 && uVar16 != 0x1fffffff) || (iVar8 = Gia_ObjIsBuf(pGVar10), iVar8 != 0)) {
    Gia_ObjRefInc(p->pGia,pGVar10 + -uVar16);
  }
  else if ((-1 < iVar7 && (int)uVar16 != 0x1fffffff) &&
          (iVar7 = Gia_ObjRefNum(p->pGia,pGVar10), 0 < iVar7)) {
    if ((pGVar10->field_0x3 & 0x40) != 0) {
      __assert_fail("Jf_ObjIsUnit(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                    ,0x52b,"int Jf_ManComputeRefs(Jf_Man_t *)");
    }
    piVar11 = Jf_ObjCuts(p,iVar14);
    c = (uint *)(piVar11 + 1);
    for (i = 1; uVar9 = *c & 0xf, i <= uVar9; i = i + 1) {
      pGVar15 = p->pGia;
      uVar9 = Jf_CutVar((int *)c,i);
      piVar11 = pGVar15->pRefs + uVar9;
      *piVar11 = *piVar11 + 1;
    }
    pJVar12 = p->pPars;
    if (pJVar12->fGenCnf != 0) {
      iVar7 = Jf_CutCnfSize(p,(int *)c);
      pJVar12 = p->pPars;
      pJVar12->Clause = pJVar12->Clause + (long)iVar7;
      uVar9 = *c & 0xf;
    }
    pJVar12->Area = pJVar12->Area + 1;
    pJVar12->Edge = (ulong)uVar9 + pJVar12->Edge;
  }
  pGVar15 = p->pGia;
  goto LAB_005ec3f8;
}

Assistant:

int Jf_ManComputeDelay( Jf_Man_t * p, int fEval )
{
    Gia_Obj_t * pObj; 
    int i, Delay = 0;
    if ( fEval )
    {
        Gia_ManForEachObj( p->pGia, pObj, i )
            if ( Gia_ObjIsBuf(pObj) )
                Jf_ObjPropagateBuf( p, pObj, 0 );
            else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
                Vec_IntWriteEntry( &p->vArr, i, Jf_CutArr(p, Jf_ObjCutBest(p, i)) );
    }
    Gia_ManForEachCoDriver( p->pGia, pObj, i )
    {
        assert( Gia_ObjRefNum(p->pGia, pObj) > 0 );
        Delay = Abc_MaxInt( Delay, Jf_ObjArr(p, Gia_ObjId(p->pGia, pObj)) );
    }
    return Delay;
}